

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O2

vector<unsigned_int,_std::allocator<unsigned_int>_> *
cfd::core::ToArrayFromString
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          string *string_path,string *caller_name,uint8_t depth)

{
  char cVar1;
  int __base;
  bool bVar2;
  bool bVar3;
  ulong uVar4;
  CfdException *pCVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  char *p_str_end;
  undefined1 local_88 [32];
  string str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  list;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::__cxx11::string::string((string *)&str,"/",(allocator *)local_88);
  StringUtil::Split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&list,(string *)string_path,(string *)&str);
  ::std::__cxx11::string::~string((string *)&str);
  lVar7 = 0;
  uVar8 = 0;
  do {
    if ((ulong)((long)list.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)list.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar8) {
      if ((__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
          _M_impl.super__Vector_impl_data._M_start !=
          (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
          _M_impl.super__Vector_impl_data._M_finish) {
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&list);
        return __return_storage_ptr__;
      }
      str._M_dataplus._M_p = "cfdcore_hdwallet.cpp";
      str._M_string_length._0_4_ = 0x69;
      str.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_58f088;
      logger::warn<std::__cxx11::string_const&>
                ((CfdSourceLocation *)&str,"{} bip32 string path empty.",caller_name);
      pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::operator+(&str,caller_name," bip32 string path empty.");
      CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,&str);
      __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ::std::__cxx11::string::string
              ((string *)&str,
               (string *)
               ((long)&((list.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar7));
    if (CONCAT44(str._M_string_length._4_4_,(undefined4)str._M_string_length) < 2) {
LAB_0039742f:
      bVar2 = false;
    }
    else {
      cVar1 = str._M_dataplus._M_p
              [CONCAT44(str._M_string_length._4_4_,(undefined4)str._M_string_length) - 1];
      if (((cVar1 != '\'') && (cVar1 != 'h')) && (cVar1 != 'H')) goto LAB_0039742f;
      ::std::__cxx11::string::substr((ulong)local_88,(ulong)&str);
      ::std::__cxx11::string::operator=((string *)&str,(string *)local_88);
      ::std::__cxx11::string::~string((string *)local_88);
      bVar2 = true;
    }
    bVar3 = ::std::operator==(&str,"m");
    if (bVar3) {
LAB_00397499:
      if (depth != '\0') {
        local_88._0_8_ = "cfdcore_hdwallet.cpp";
        local_88._8_4_ = 0x40;
        local_88._16_8_ = "ToArrayFromString";
        logger::warn<std::__cxx11::string_const&>
                  ((CfdSourceLocation *)local_88,"{} bip32 path fail. this key is not master key.",
                   caller_name);
        pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_88,caller_name," bip32 path fail. this key is not master key.");
        CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)local_88);
        __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
      }
    }
    else {
      bVar3 = ::std::operator==(&str,"M");
      if (bVar3) goto LAB_00397499;
      if (CONCAT44(str._M_string_length._4_4_,(undefined4)str._M_string_length) == 0) {
        if (uVar8 != 0) {
          local_88._0_8_ = "cfdcore_hdwallet.cpp";
          local_88._8_4_ = 0x4e;
          local_88._16_8_ = "ToArrayFromString";
          logger::warn<std::__cxx11::string_const&>
                    ((CfdSourceLocation *)local_88,"{} bip32 string path fail. empty item.",
                     caller_name);
          pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_88,caller_name," bip32 string path fail. empty item.");
          CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)local_88);
          __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
        }
      }
      else {
        p_str_end = (char *)0x0;
        if (((CONCAT44(str._M_string_length._4_4_,(undefined4)str._M_string_length) < 3) ||
            (*str._M_dataplus._M_p != '0')) || (str._M_dataplus._M_p[1] != 'x')) {
          __base = 10;
        }
        else {
          __base = 0x10;
        }
        uVar4 = strtoul(str._M_dataplus._M_p,&p_str_end,__base);
        if ((CONCAT44(str._M_string_length._4_4_,(undefined4)str._M_string_length) == 0) ||
           ((p_str_end != (char *)0x0 && (*p_str_end != '\0')))) {
          local_88._0_8_ = "cfdcore_hdwallet.cpp";
          local_88._8_4_ = 0x5f;
          local_88._16_8_ = "ToArrayFromString";
          logger::warn<std::__cxx11::string_const&>
                    ((CfdSourceLocation *)local_88,"{} bip32 string path fail.",caller_name);
          pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_88,caller_name," bip32 string path fail.");
          CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)local_88);
          __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
        }
        uVar6 = (uint)uVar4 | 0x80000000;
        if (!bVar2) {
          uVar6 = (uint)uVar4;
        }
        local_88._0_4_ = uVar6;
        ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (__return_storage_ptr__,(uint *)local_88);
      }
    }
    ::std::__cxx11::string::~string((string *)&str);
    uVar8 = uVar8 + 1;
    lVar7 = lVar7 + 0x20;
  } while( true );
}

Assistant:

static std::vector<uint32_t> ToArrayFromString(
    const std::string& string_path, const std::string& caller_name,
    uint8_t depth) {
  std::vector<uint32_t> result;
  std::vector<std::string> list = StringUtil::Split(string_path, "/");
  for (size_t index = 0; index < list.size(); ++index) {
    std::string str = list[index];
    bool hardened = false;
    if (str.size() <= 1) {
      // do nothing
    } else if (
        (str.back() == '\'') || (str.back() == 'h') || (str.back() == 'H')) {
      str = str.substr(0, str.size() - 1);
      hardened = true;
    }
    if ((str == "m") || (str == "M")) {
      if (depth != 0) {
        warn(
            CFD_LOG_SOURCE, "{} bip32 path fail. this key is not master key.",
            caller_name);
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            caller_name + " bip32 path fail. this key is not master key.");
      }
      continue;  // master key
    }
    if (str.empty()) {
      if (index == 0) {
        // start slash pattern
        continue;
      } else {
        warn(
            CFD_LOG_SOURCE, "{} bip32 string path fail. empty item.",
            caller_name);
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            caller_name + " bip32 string path fail. empty item.");
      }
    }

    // Conversion by strtol function
    char* p_str_end = nullptr;
    uint32_t value;
    if ((str.size() > 2) && (str[0] == '0') && (str[1] == 'x')) {
      value = std::strtoul(str.c_str(), &p_str_end, 16);
    } else {
      value = std::strtoul(str.c_str(), &p_str_end, 10);
    }
    if (str.empty() || ((p_str_end != nullptr) && (*p_str_end != '\0'))) {
      warn(CFD_LOG_SOURCE, "{} bip32 string path fail.", caller_name);
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          caller_name + " bip32 string path fail.");
    }
    if (hardened) value |= 0x80000000;
    result.push_back(static_cast<uint32_t>(value));
  }

  if (result.empty()) {
    warn(CFD_LOG_SOURCE, "{} bip32 string path empty.", caller_name);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        caller_name + " bip32 string path empty.");
  }

  return result;
}